

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O2

void Intra4Preds_C(uint8_t *dst,uint8_t *top)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  undefined4 uVar7;
  ulong uVar8;
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined7 uVar13;
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  uint7 uVar17;
  uint8_t *puVar18;
  uint8_t uVar19;
  long lVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  byte bVar24;
  ushort uVar25;
  ushort uVar26;
  byte bVar31;
  short sVar28;
  ushort uVar29;
  ushort uVar30;
  short sVar32;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  undefined1 auVar27 [16];
  undefined1 auVar37 [16];
  
  uVar21 = 4;
  lVar20 = -5;
  while( true ) {
    if (lVar20 + 1 == 0) break;
    uVar21 = uVar21 + top[lVar20 + 5] + (uint)top[lVar20];
    lVar20 = lVar20 + 1;
  }
  Fill(dst + 0x600,uVar21 >> 3,4);
  puVar18 = dst + 0x604;
  bVar24 = top[-1];
  for (lVar20 = 0; lVar20 != 4; lVar20 = lVar20 + 1) {
    bVar31 = top[-2 - lVar20];
    for (lVar23 = 0; lVar23 != 4; lVar23 = lVar23 + 1) {
      puVar18[lVar23] = clip1[(ulong)top[lVar23] + (ulong)bVar31 + (0xff - (ulong)bVar24)];
    }
    puVar18 = puVar18 + 0x20;
  }
  uVar7 = *(undefined4 *)top;
  bVar31 = (byte)((uint)uVar7 >> 0x18);
  uVar13 = CONCAT25((short)(((uint7)bVar31 << 0x30) >> 0x28),
                    CONCAT14((char)((uint)uVar7 >> 0x10),uVar7));
  uVar17 = (uint7)CONCAT41((int)(CONCAT34((int3)((uint7)uVar13 >> 0x20),uVar7) >> 0x18),
                           (char)((uint)uVar7 >> 8)) & 0xffffff00ff;
  bVar24 = (byte)uVar7;
  sVar28 = (short)uVar17;
  sVar32 = (short)((uint7)uVar13 >> 0x20);
  auVar9[0xe] = bVar31;
  auVar9._0_14_ = ZEXT414(0);
  auVar11._10_2_ = sVar32;
  auVar11._0_10_ = (unkuint10)0;
  auVar11._12_3_ = auVar9._12_3_;
  auVar14._10_5_ = auVar11._10_5_;
  auVar14._0_10_ = (unkuint10)0;
  auVar16._2_7_ = auVar14._8_7_;
  auVar16._0_2_ = sVar28;
  auVar16._9_6_ = 0;
  auVar37._0_2_ = CONCAT11(0,top[-1]);
  auVar27 = ZEXT516(CONCAT14(bVar31,SUB154(auVar16 << 0x30,4))) << 0x40;
  auVar10._12_2_ = sVar32 + 2;
  auVar10._0_12_ = auVar27._0_12_;
  auVar10[0xe] = bVar31;
  auVar12._10_2_ = sVar32;
  auVar12._0_10_ = auVar27._0_10_;
  auVar12._12_3_ = auVar10._12_3_;
  auVar15._10_5_ = auVar12._10_5_;
  auVar15._8_2_ = sVar28 + 2;
  auVar15._6_2_ = sVar28;
  auVar15._0_6_ = (uint6)bVar24 << 0x20;
  auVar37[2] = bVar24;
  auVar37[3] = 0;
  auVar37._4_11_ = auVar15._4_11_;
  auVar37[0xf] = 0;
  auVar27 = pshufhw(ZEXT716(CONCAT52((int5)uVar17,(ushort)bVar24)),auVar37,0xf8);
  uVar8 = auVar27._8_8_ & 0xffffffffffff;
  uVar25 = (ushort)((short)uVar8 + (ushort)bVar24 * 2 + auVar37._0_2_) >> 2;
  uVar29 = (ushort)((short)(uVar8 >> 0x10) + sVar28 * 2 + (ushort)bVar24) >> 2;
  uVar33 = (ushort)((short)(uVar8 >> 0x20) + sVar32 * 2 + sVar28 + 2) >> 2;
  uVar35 = (ushort)((ushort)top[4] + (ushort)bVar31 * 2 + sVar32 + 2) >> 2;
  uVar26 = uVar25 & 0xff;
  uVar30 = uVar29 & 0xff;
  uVar34 = uVar33 & 0xff;
  uVar36 = uVar35 & 0xff;
  for (lVar20 = 0; lVar20 != 0x80; lVar20 = lVar20 + 0x20) {
    *(uint *)(dst + lVar20 + 0x608) =
         CONCAT13((uVar36 != 0) * (uVar36 < 0x100) * (char)uVar35 - (0xff < uVar36),
                  CONCAT12((uVar34 != 0) * (uVar34 < 0x100) * (char)uVar33 - (0xff < uVar34),
                           CONCAT11((uVar30 != 0) * (uVar30 < 0x100) * (char)uVar29 -
                                    (0xff < uVar30),
                                    (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar25 -
                                    (0xff < uVar26))));
  }
  bVar24 = top[-2];
  bVar31 = top[-3];
  bVar1 = top[-4];
  bVar2 = top[-5];
  *(uint *)(dst + 0x60c) = ((uint)top[-1] + (uint)bVar24 * 2 + (uint)bVar31 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x62c) = ((uint)bVar24 + (uint)bVar31 * 2 + (uint)bVar1 + 2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x64c) = ((uint)bVar31 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2) * 0x1010101;
  *(uint *)(dst + 0x66c) = ((uint)bVar1 + (uint)bVar2 + 2 + (uint)bVar2 * 2 >> 2) * 0x1010101;
  bVar24 = top[-1];
  bVar31 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  bVar4 = top[1];
  bVar5 = top[2];
  bVar6 = top[3];
  dst[0x670] = (uint8_t)((uint)top[-5] + (uint)bVar1 + (uint)bVar2 * 2 + 2 >> 2);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x671] = uVar19;
  dst[0x650] = uVar19;
  uVar19 = (uint8_t)((uint)bVar24 + (uint)bVar31 * 2 + 2 + (uint)bVar1 >> 2);
  dst[0x672] = uVar19;
  dst[0x651] = uVar19;
  dst[0x630] = uVar19;
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar24 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x673] = uVar19;
  dst[0x652] = uVar19;
  dst[0x631] = uVar19;
  dst[0x610] = uVar19;
  uVar19 = (uint8_t)((uint)bVar24 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x653] = uVar19;
  dst[0x632] = uVar19;
  dst[0x611] = uVar19;
  uVar19 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x633] = uVar19;
  dst[0x612] = uVar19;
  dst[0x613] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar24 = top[-1];
  bVar31 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = *top;
  uVar22 = (uint)bVar3;
  bVar4 = top[1];
  uVar21 = (uint)bVar4;
  bVar5 = top[2];
  bVar6 = top[3];
  uVar19 = (uint8_t)((uint)bVar3 + (uint)bVar24 + 1 >> 1);
  dst[0x655] = uVar19;
  dst[0x614] = uVar19;
  uVar19 = (uint8_t)((uint)bVar3 + (uint)bVar4 + 1 >> 1);
  dst[0x656] = uVar19;
  dst[0x615] = uVar19;
  uVar19 = (uint8_t)((uint)bVar5 + (uint)bVar4 + 1 >> 1);
  dst[0x657] = uVar19;
  dst[0x616] = uVar19;
  dst[0x617] = (uint8_t)((uint)bVar5 + (uint)bVar6 + 1 >> 1);
  dst[0x674] = (uint8_t)((uint)bVar2 + (uint)bVar31 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x654] = (uint8_t)((uint)bVar1 + (uint)bVar24 + 2 + (uint)bVar31 * 2 >> 2);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar24 * 2 + 2 + uVar22 >> 2);
  dst[0x675] = uVar19;
  dst[0x634] = uVar19;
  uVar19 = (uint8_t)((uint)bVar24 + uVar22 * 2 + 2 + uVar21 >> 2);
  dst[0x676] = uVar19;
  dst[0x635] = uVar19;
  uVar19 = (uint8_t)(uVar22 + uVar21 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x677] = uVar19;
  dst[0x636] = uVar19;
  dst[0x637] = (uint8_t)(uVar21 + (uint)bVar5 * 2 + (uint)bVar6 + 2 >> 2);
  bVar24 = top[1];
  bVar31 = top[2];
  bVar1 = top[3];
  bVar2 = top[4];
  bVar3 = top[5];
  bVar4 = top[6];
  bVar5 = top[7];
  dst[0x618] = (uint8_t)((uint)*top + (uint)bVar24 * 2 + (uint)bVar31 + 2 >> 2);
  uVar19 = (uint8_t)((uint)bVar24 + (uint)bVar31 * 2 + (uint)bVar1 + 2 >> 2);
  dst[0x638] = uVar19;
  dst[0x619] = uVar19;
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 * 2 + 2 + (uint)bVar2 >> 2);
  dst[0x658] = uVar19;
  dst[0x639] = uVar19;
  dst[0x61a] = uVar19;
  uVar19 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x678] = uVar19;
  dst[0x659] = uVar19;
  dst[0x63a] = uVar19;
  dst[0x61b] = uVar19;
  uVar19 = (uint8_t)((uint)bVar2 + (uint)bVar4 + 2 + (uint)bVar3 * 2 >> 2);
  dst[0x679] = uVar19;
  dst[0x65a] = uVar19;
  dst[0x63b] = uVar19;
  uVar19 = (uint8_t)((uint)bVar3 + (uint)bVar5 + (uint)bVar4 * 2 + 2 >> 2);
  dst[0x67a] = uVar19;
  dst[0x65b] = uVar19;
  dst[0x67b] = (uint8_t)((uint)bVar4 + (uint)bVar5 + 2 + (uint)bVar5 * 2 >> 2);
  bVar24 = *top;
  bVar31 = top[1];
  bVar1 = top[2];
  bVar2 = top[3];
  bVar3 = top[4];
  bVar4 = top[5];
  bVar5 = top[6];
  bVar6 = top[7];
  dst[0x61c] = (uint8_t)((uint)bVar31 + (uint)bVar24 + 1 >> 1);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 + 1 >> 1);
  dst[0x65c] = uVar19;
  dst[0x61d] = uVar19;
  uVar19 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x65d] = uVar19;
  dst[0x61e] = uVar19;
  uVar19 = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x65e] = uVar19;
  dst[0x61f] = uVar19;
  dst[0x63c] = (uint8_t)((uint)bVar24 + (uint)bVar31 * 2 + (uint)bVar1 + 2 >> 2);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 * 2 + (uint)bVar2 + 2 >> 2);
  dst[0x67c] = uVar19;
  dst[0x63d] = uVar19;
  uVar19 = (uint8_t)((uint)bVar1 + (uint)bVar2 * 2 + 2 + (uint)bVar3 >> 2);
  dst[0x67d] = uVar19;
  dst[0x63e] = uVar19;
  uVar19 = (uint8_t)((uint)bVar2 + (uint)bVar3 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x67e] = uVar19;
  dst[0x63f] = uVar19;
  dst[0x65f] = (uint8_t)((uint)bVar3 + (uint)bVar4 * 2 + (uint)bVar5 + 2 >> 2);
  dst[0x67f] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  bVar24 = top[-1];
  bVar31 = top[-2];
  bVar1 = top[-3];
  bVar2 = top[-4];
  bVar3 = top[-5];
  bVar4 = *top;
  bVar5 = top[1];
  bVar6 = top[2];
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar24 + 1 >> 1);
  dst[0x6a2] = uVar19;
  dst[0x680] = uVar19;
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 + 1 >> 1);
  dst[0x6c2] = uVar19;
  dst[0x6a0] = uVar19;
  uVar19 = (uint8_t)((uint)bVar2 + (uint)bVar1 + 1 >> 1);
  dst[0x6e2] = uVar19;
  dst[0x6c0] = uVar19;
  dst[0x6e0] = (uint8_t)((uint)bVar2 + (uint)bVar3 + 1 >> 1);
  dst[0x683] = (uint8_t)((uint)bVar6 + (uint)bVar4 + (uint)bVar5 * 2 + 2 >> 2);
  dst[0x682] = (uint8_t)((uint)bVar24 + (uint)bVar4 * 2 + 2 + (uint)bVar5 >> 2);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar24 * 2 + 2 + (uint)bVar4 >> 2);
  dst[0x6a3] = uVar19;
  dst[0x681] = uVar19;
  uVar19 = (uint8_t)((uint)bVar24 + (uint)bVar1 + 2 + (uint)bVar31 * 2 >> 2);
  dst[0x6c3] = uVar19;
  dst[0x6a1] = uVar19;
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar2 + 2 + (uint)bVar1 * 2 >> 2);
  dst[0x6e3] = uVar19;
  dst[0x6c1] = uVar19;
  dst[0x6e1] = (uint8_t)((uint)bVar1 + (uint)bVar3 + (uint)bVar2 * 2 + 2 >> 2);
  bVar24 = top[-2];
  bVar31 = top[-3];
  bVar1 = top[-4];
  bVar2 = top[-5];
  dst[0x684] = (uint8_t)((uint)bVar31 + (uint)bVar24 + 1 >> 1);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar1 + 1 >> 1);
  dst[0x6a4] = uVar19;
  dst[0x686] = uVar19;
  uVar19 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 1 >> 1);
  dst[0x6c4] = uVar19;
  dst[0x6a6] = uVar19;
  dst[0x685] = (uint8_t)((uint)bVar24 + (uint)bVar31 * 2 + (uint)bVar1 + 2 >> 2);
  uVar19 = (uint8_t)((uint)bVar31 + (uint)bVar2 + (uint)bVar1 * 2 + 2 >> 2);
  dst[0x6a5] = uVar19;
  dst[0x687] = uVar19;
  uVar19 = (uint8_t)((uint)bVar1 + (uint)bVar2 + 2 + (uint)bVar2 * 2 >> 2);
  dst[0x6c5] = uVar19;
  dst[0x6a7] = uVar19;
  auVar27 = pshuflw(ZEXT216(CONCAT11(bVar2,bVar2)),ZEXT216(CONCAT11(bVar2,bVar2)),0);
  *(int *)(dst + 0x6e4) = auVar27._0_4_;
  dst[0x6c6] = bVar2;
  dst[0x6c7] = bVar2;
  return;
}

Assistant:

static void Intra4Preds_C(uint8_t* dst, const uint8_t* top) {
  DC4(I4DC4 + dst, top);
  TM4(I4TM4 + dst, top);
  VE4(I4VE4 + dst, top);
  HE4(I4HE4 + dst, top);
  RD4(I4RD4 + dst, top);
  VR4(I4VR4 + dst, top);
  LD4(I4LD4 + dst, top);
  VL4(I4VL4 + dst, top);
  HD4(I4HD4 + dst, top);
  HU4(I4HU4 + dst, top);
}